

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O2

void read_debug_slice_header(h264_stream_t *h,bs_t *b)

{
  slice_header_t *__s;
  nal_t *pnVar1;
  sps_t *psVar2;
  pps_t *__dest;
  uint32_t uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  FILE *pFVar9;
  
  __s = h->sh;
  memset(__s,0,0x1b80);
  pFVar9 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar9 = _stdout;
  }
  pnVar1 = h->nal;
  fprintf(pFVar9,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar3 = bs_read_ue(b);
  __s->first_mb_in_slice = uVar3;
  pFVar9 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar9 = _stdout;
  }
  fprintf(pFVar9,"sh->first_mb_in_slice: %d \n",(ulong)uVar3);
  pFVar9 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar9 = _stdout;
  }
  fprintf(pFVar9,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar3 = bs_read_ue(b);
  __s->slice_type = uVar3;
  pFVar9 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar9 = _stdout;
  }
  fprintf(pFVar9,"sh->slice_type: %d \n",(ulong)uVar3);
  pFVar9 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar9 = _stdout;
  }
  fprintf(pFVar9,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar3 = bs_read_ue(b);
  __s->pic_parameter_set_id = uVar3;
  pFVar9 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar9 = _stdout;
  }
  fprintf(pFVar9,"sh->pic_parameter_set_id: %d \n",(ulong)uVar3);
  psVar2 = h->sps;
  __dest = h->pps;
  memcpy(__dest,h->pps_table[__s->pic_parameter_set_id],0x87c);
  memcpy(h->sps,h->sps_table[__dest->seq_parameter_set_id],0x1028);
  if (psVar2->residual_colour_transform_flag != 0) {
    pFVar9 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar9 = _stdout;
    }
    fprintf(pFVar9,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar3 = bs_read_u(b,2);
    __s->colour_plane_id = uVar3;
    pFVar9 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar9 = _stdout;
    }
    fprintf(pFVar9,"sh->colour_plane_id: %d \n",(ulong)uVar3);
  }
  pFVar9 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar9 = _stdout;
  }
  fprintf(pFVar9,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar3 = bs_read_u(b,psVar2->log2_max_frame_num_minus4 + 4);
  __s->frame_num = uVar3;
  pFVar9 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar9 = _stdout;
  }
  fprintf(pFVar9,"sh->frame_num: %d \n",(ulong)uVar3);
  if (psVar2->frame_mbs_only_flag == 0) {
    pFVar9 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar9 = _stdout;
    }
    fprintf(pFVar9,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar3 = bs_read_u1(b);
    __s->field_pic_flag = uVar3;
    pFVar9 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar9 = _stdout;
    }
    fprintf(pFVar9,"sh->field_pic_flag: %d \n",(ulong)uVar3);
    if (__s->field_pic_flag != 0) {
      pFVar9 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar9 = _stdout;
      }
      fprintf(pFVar9,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar3 = bs_read_u1(b);
      __s->bottom_field_flag = uVar3;
      pFVar9 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar9 = _stdout;
      }
      fprintf(pFVar9,"sh->bottom_field_flag: %d \n",(ulong)uVar3);
    }
  }
  if (pnVar1->nal_unit_type == 5) {
    pFVar9 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar9 = _stdout;
    }
    fprintf(pFVar9,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar3 = bs_read_ue(b);
    __s->idr_pic_id = uVar3;
    pFVar9 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar9 = _stdout;
    }
    fprintf(pFVar9,"sh->idr_pic_id: %d \n",(ulong)uVar3);
  }
  iVar5 = psVar2->pic_order_cnt_type;
  if (iVar5 == 0) {
    pFVar9 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar9 = _stdout;
    }
    fprintf(pFVar9,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar3 = bs_read_u(b,psVar2->log2_max_pic_order_cnt_lsb_minus4 + 4);
    __s->pic_order_cnt_lsb = uVar3;
    pFVar9 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar9 = _stdout;
    }
    fprintf(pFVar9,"sh->pic_order_cnt_lsb: %d \n",(ulong)uVar3);
    if ((__dest->pic_order_present_flag != 0) && (__s->field_pic_flag == 0)) {
      pFVar9 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar9 = _stdout;
      }
      fprintf(pFVar9,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar4 = bs_read_se(b);
      __s->delta_pic_order_cnt_bottom = uVar4;
      pFVar9 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar9 = _stdout;
      }
      fprintf(pFVar9,"sh->delta_pic_order_cnt_bottom: %d \n",(ulong)uVar4);
    }
    iVar5 = psVar2->pic_order_cnt_type;
  }
  if ((iVar5 == 1) && (psVar2->delta_pic_order_always_zero_flag == 0)) {
    pFVar9 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar9 = _stdout;
    }
    fprintf(pFVar9,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar4 = bs_read_se(b);
    __s->delta_pic_order_cnt[0] = uVar4;
    pFVar9 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar9 = _stdout;
    }
    fprintf(pFVar9,"sh->delta_pic_order_cnt[ 0 ]: %d \n",(ulong)uVar4);
    if ((__dest->pic_order_present_flag != 0) && (__s->field_pic_flag == 0)) {
      pFVar9 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar9 = _stdout;
      }
      fprintf(pFVar9,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar4 = bs_read_se(b);
      __s->delta_pic_order_cnt[1] = uVar4;
      pFVar9 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar9 = _stdout;
      }
      fprintf(pFVar9,"sh->delta_pic_order_cnt[ 1 ]: %d \n",(ulong)uVar4);
    }
  }
  if (__dest->redundant_pic_cnt_present_flag != 0) {
    pFVar9 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar9 = _stdout;
    }
    fprintf(pFVar9,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar3 = bs_read_ue(b);
    __s->redundant_pic_cnt = uVar3;
    pFVar9 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar9 = _stdout;
    }
    fprintf(pFVar9,"sh->redundant_pic_cnt: %d \n",(ulong)uVar3);
  }
  uVar6 = __s->slice_type;
  uVar4 = uVar6 - 5;
  uVar8 = uVar6;
  if (4 < (int)uVar6) {
    uVar8 = uVar4;
  }
  if (uVar8 == 1) {
    pFVar9 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar9 = _stdout;
    }
    fprintf(pFVar9,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar3 = bs_read_u1(b);
    __s->direct_spatial_mv_pred_flag = uVar3;
    pFVar9 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar9 = _stdout;
    }
    fprintf(pFVar9,"sh->direct_spatial_mv_pred_flag: %d \n",(ulong)uVar3);
    uVar6 = __s->slice_type;
    uVar4 = uVar6 - 5;
  }
  if ((int)uVar6 < 5) {
    uVar4 = uVar6;
  }
  if ((uVar4 < 4) && (uVar4 != 2)) {
    pFVar9 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar9 = _stdout;
    }
    fprintf(pFVar9,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar3 = bs_read_u1(b);
    __s->num_ref_idx_active_override_flag = uVar3;
    pFVar9 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar9 = _stdout;
    }
    fprintf(pFVar9,"sh->num_ref_idx_active_override_flag: %d \n",(ulong)uVar3);
    if (__s->num_ref_idx_active_override_flag != 0) {
      pFVar9 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar9 = _stdout;
      }
      fprintf(pFVar9,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar3 = bs_read_ue(b);
      __s->num_ref_idx_l0_active_minus1 = uVar3;
      pFVar9 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar9 = _stdout;
      }
      fprintf(pFVar9,"sh->num_ref_idx_l0_active_minus1: %d \n",(ulong)uVar3);
      iVar5 = __s->slice_type;
      iVar7 = iVar5 + -5;
      if (iVar5 < 5) {
        iVar7 = iVar5;
      }
      if (iVar7 == 1) {
        pFVar9 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar9 = _stdout;
        }
        fprintf(pFVar9,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
        uVar3 = bs_read_ue(b);
        __s->num_ref_idx_l1_active_minus1 = uVar3;
        pFVar9 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar9 = _stdout;
        }
        fprintf(pFVar9,"sh->num_ref_idx_l1_active_minus1: %d \n",(ulong)uVar3);
      }
    }
  }
  read_debug_ref_pic_list_reordering(h,b);
  if (__dest->weighted_pred_flag == 0) {
LAB_00126064:
    if (__dest->weighted_bipred_idc == 1) {
      iVar5 = __s->slice_type;
      iVar7 = iVar5 + -5;
      if (iVar5 < 5) {
        iVar7 = iVar5;
      }
      if (iVar7 == 1) goto LAB_0012607f;
    }
  }
  else {
    iVar5 = __s->slice_type;
    iVar7 = iVar5 + -5;
    if (iVar5 < 5) {
      iVar7 = iVar5;
    }
    if ((iVar7 != 0) && (iVar7 != 3)) goto LAB_00126064;
LAB_0012607f:
    read_debug_pred_weight_table(h,b);
  }
  if (pnVar1->nal_ref_idc != 0) {
    read_debug_dec_ref_pic_marking(h,b);
  }
  if (__dest->entropy_coding_mode_flag != 0) {
    iVar5 = __s->slice_type;
    iVar7 = iVar5 + -5;
    if (iVar5 < 5) {
      iVar7 = iVar5;
    }
    if ((iVar7 != 2) && (iVar7 != 4)) {
      pFVar9 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar9 = _stdout;
      }
      fprintf(pFVar9,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar3 = bs_read_ue(b);
      __s->cabac_init_idc = uVar3;
      pFVar9 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar9 = _stdout;
      }
      fprintf(pFVar9,"sh->cabac_init_idc: %d \n",(ulong)uVar3);
    }
  }
  pFVar9 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar9 = _stdout;
  }
  fprintf(pFVar9,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar4 = bs_read_se(b);
  __s->slice_qp_delta = uVar4;
  pFVar9 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar9 = _stdout;
  }
  fprintf(pFVar9,"sh->slice_qp_delta: %d \n",(ulong)uVar4);
  iVar5 = __s->slice_type;
  iVar7 = iVar5 + -5;
  if (iVar5 < 5) {
    iVar7 = iVar5;
  }
  if (iVar7 != 4) {
    if (iVar7 != 3) goto LAB_00126226;
    pFVar9 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar9 = _stdout;
    }
    fprintf(pFVar9,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar3 = bs_read_u1(b);
    __s->sp_for_switch_flag = uVar3;
    pFVar9 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar9 = _stdout;
    }
    fprintf(pFVar9,"sh->sp_for_switch_flag: %d \n",(ulong)uVar3);
  }
  pFVar9 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar9 = _stdout;
  }
  fprintf(pFVar9,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar4 = bs_read_se(b);
  __s->slice_qs_delta = uVar4;
  pFVar9 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar9 = _stdout;
  }
  fprintf(pFVar9,"sh->slice_qs_delta: %d \n",(ulong)uVar4);
LAB_00126226:
  if (__dest->deblocking_filter_control_present_flag != 0) {
    pFVar9 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar9 = _stdout;
    }
    fprintf(pFVar9,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar3 = bs_read_ue(b);
    __s->disable_deblocking_filter_idc = uVar3;
    pFVar9 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar9 = _stdout;
    }
    fprintf(pFVar9,"sh->disable_deblocking_filter_idc: %d \n",(ulong)uVar3);
    if (__s->disable_deblocking_filter_idc != 1) {
      pFVar9 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar9 = _stdout;
      }
      fprintf(pFVar9,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar4 = bs_read_se(b);
      __s->slice_alpha_c0_offset_div2 = uVar4;
      pFVar9 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar9 = _stdout;
      }
      fprintf(pFVar9,"sh->slice_alpha_c0_offset_div2: %d \n",(ulong)uVar4);
      pFVar9 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar9 = _stdout;
      }
      fprintf(pFVar9,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar4 = bs_read_se(b);
      __s->slice_beta_offset_div2 = uVar4;
      pFVar9 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar9 = _stdout;
      }
      fprintf(pFVar9,"sh->slice_beta_offset_div2: %d \n",(ulong)uVar4);
    }
  }
  if ((0 < __dest->num_slice_groups_minus1) && (__dest->slice_group_map_type - 3U < 3)) {
    iVar5 = intlog2(__dest->pic_size_in_map_units_minus1 + __dest->slice_group_change_rate_minus1 +
                    1);
    pFVar9 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar9 = _stdout;
    }
    fprintf(pFVar9,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar3 = bs_read_u(b,iVar5);
    __s->slice_group_change_cycle = uVar3;
    pFVar9 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar9 = _stdout;
    }
    fprintf(pFVar9,"sh->slice_group_change_cycle: %d \n",(ulong)uVar3);
    return;
  }
  return;
}

Assistant:

void read_debug_slice_header(h264_stream_t* h, bs_t* b)
{
    slice_header_t* sh = h->sh;
    if( 1 )
    {
        memset(sh, 0, sizeof(slice_header_t));
    }

    nal_t* nal = h->nal;

    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->first_mb_in_slice = bs_read_ue(b); printf("sh->first_mb_in_slice: %d \n", sh->first_mb_in_slice); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->slice_type = bs_read_ue(b); printf("sh->slice_type: %d \n", sh->slice_type); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pic_parameter_set_id = bs_read_ue(b); printf("sh->pic_parameter_set_id: %d \n", sh->pic_parameter_set_id); 

    // TODO check existence, otherwise fail
    pps_t* pps = h->pps;
    sps_t* sps = h->sps;
    memcpy(h->pps, h->pps_table[sh->pic_parameter_set_id], sizeof(pps_t));
    memcpy(h->sps, h->sps_table[pps->seq_parameter_set_id], sizeof(sps_t));

    if (sps->residual_colour_transform_flag)
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->colour_plane_id = bs_read_u(b, 2); printf("sh->colour_plane_id: %d \n", sh->colour_plane_id); 
    }

    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->frame_num = bs_read_u(b, sps->log2_max_frame_num_minus4 + 4 ); printf("sh->frame_num: %d \n", sh->frame_num);  // was u(v)
    if( !sps->frame_mbs_only_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->field_pic_flag = bs_read_u1(b); printf("sh->field_pic_flag: %d \n", sh->field_pic_flag); 
        if( sh->field_pic_flag )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->bottom_field_flag = bs_read_u1(b); printf("sh->bottom_field_flag: %d \n", sh->bottom_field_flag); 
        }
    }
    if( nal->nal_unit_type == 5 )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->idr_pic_id = bs_read_ue(b); printf("sh->idr_pic_id: %d \n", sh->idr_pic_id); 
    }
    if( sps->pic_order_cnt_type == 0 )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pic_order_cnt_lsb = bs_read_u(b, sps->log2_max_pic_order_cnt_lsb_minus4 + 4 ); printf("sh->pic_order_cnt_lsb: %d \n", sh->pic_order_cnt_lsb);  // was u(v)
        if( pps->pic_order_present_flag && !sh->field_pic_flag )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->delta_pic_order_cnt_bottom = bs_read_se(b); printf("sh->delta_pic_order_cnt_bottom: %d \n", sh->delta_pic_order_cnt_bottom); 
        }
    }
    if( sps->pic_order_cnt_type == 1 && !sps->delta_pic_order_always_zero_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->delta_pic_order_cnt[ 0 ] = bs_read_se(b); printf("sh->delta_pic_order_cnt[ 0 ]: %d \n", sh->delta_pic_order_cnt[ 0 ]); 
        if( pps->pic_order_present_flag && !sh->field_pic_flag )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->delta_pic_order_cnt[ 1 ] = bs_read_se(b); printf("sh->delta_pic_order_cnt[ 1 ]: %d \n", sh->delta_pic_order_cnt[ 1 ]); 
        }
    }
    if( pps->redundant_pic_cnt_present_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->redundant_pic_cnt = bs_read_ue(b); printf("sh->redundant_pic_cnt: %d \n", sh->redundant_pic_cnt); 
    }
    if( is_slice_type( sh->slice_type, SH_SLICE_TYPE_B ) )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->direct_spatial_mv_pred_flag = bs_read_u1(b); printf("sh->direct_spatial_mv_pred_flag: %d \n", sh->direct_spatial_mv_pred_flag); 
    }
    if( is_slice_type( sh->slice_type, SH_SLICE_TYPE_P ) || is_slice_type( sh->slice_type, SH_SLICE_TYPE_SP ) || is_slice_type( sh->slice_type, SH_SLICE_TYPE_B ) )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->num_ref_idx_active_override_flag = bs_read_u1(b); printf("sh->num_ref_idx_active_override_flag: %d \n", sh->num_ref_idx_active_override_flag); 
        if( sh->num_ref_idx_active_override_flag )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->num_ref_idx_l0_active_minus1 = bs_read_ue(b); printf("sh->num_ref_idx_l0_active_minus1: %d \n", sh->num_ref_idx_l0_active_minus1);  // FIXME does this modify the pps?
            if( is_slice_type( sh->slice_type, SH_SLICE_TYPE_B ) )
            {
                printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->num_ref_idx_l1_active_minus1 = bs_read_ue(b); printf("sh->num_ref_idx_l1_active_minus1: %d \n", sh->num_ref_idx_l1_active_minus1); 
            }
        }
    }
    read_debug_ref_pic_list_reordering(h, b);
    if( ( pps->weighted_pred_flag && ( is_slice_type( sh->slice_type, SH_SLICE_TYPE_P ) || is_slice_type( sh->slice_type, SH_SLICE_TYPE_SP ) ) ) ||
        ( pps->weighted_bipred_idc == 1 && is_slice_type( sh->slice_type, SH_SLICE_TYPE_B ) ) )
    {
        read_debug_pred_weight_table(h, b);
    }
    if( nal->nal_ref_idc != 0 )
    {
        read_debug_dec_ref_pic_marking(h, b);
    }
    if( pps->entropy_coding_mode_flag && ! is_slice_type( sh->slice_type, SH_SLICE_TYPE_I ) && ! is_slice_type( sh->slice_type, SH_SLICE_TYPE_SI ) )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->cabac_init_idc = bs_read_ue(b); printf("sh->cabac_init_idc: %d \n", sh->cabac_init_idc); 
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->slice_qp_delta = bs_read_se(b); printf("sh->slice_qp_delta: %d \n", sh->slice_qp_delta); 
    if( is_slice_type( sh->slice_type, SH_SLICE_TYPE_SP ) || is_slice_type( sh->slice_type, SH_SLICE_TYPE_SI ) )
    {
        if( is_slice_type( sh->slice_type, SH_SLICE_TYPE_SP ) )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->sp_for_switch_flag = bs_read_u1(b); printf("sh->sp_for_switch_flag: %d \n", sh->sp_for_switch_flag); 
        }
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->slice_qs_delta = bs_read_se(b); printf("sh->slice_qs_delta: %d \n", sh->slice_qs_delta); 
    }
    if( pps->deblocking_filter_control_present_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->disable_deblocking_filter_idc = bs_read_ue(b); printf("sh->disable_deblocking_filter_idc: %d \n", sh->disable_deblocking_filter_idc); 
        if( sh->disable_deblocking_filter_idc != 1 )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->slice_alpha_c0_offset_div2 = bs_read_se(b); printf("sh->slice_alpha_c0_offset_div2: %d \n", sh->slice_alpha_c0_offset_div2); 
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->slice_beta_offset_div2 = bs_read_se(b); printf("sh->slice_beta_offset_div2: %d \n", sh->slice_beta_offset_div2); 
        }
    }
    if( pps->num_slice_groups_minus1 > 0 &&
        pps->slice_group_map_type >= 3 && pps->slice_group_map_type <= 5)
    {
        int v = intlog2( pps->pic_size_in_map_units_minus1 +  pps->slice_group_change_rate_minus1 + 1 );
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->slice_group_change_cycle = bs_read_u(b, v); printf("sh->slice_group_change_cycle: %d \n", sh->slice_group_change_cycle);  // FIXME add 2?
    }
}